

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasn_dec.c
# Opt level: O0

int asn1_item_ex_d2i_intern
              (ASN1_VALUE **pval,uchar **in,long len,ASN1_ITEM *it,int tag,int aclass,char opt,
              ASN1_TLC *ctx,OSSL_LIB_CTX *libctx,char *propq)

{
  ASN1_ITEM *in_RCX;
  ASN1_VALUE **in_RDI;
  int rv;
  ASN1_VALUE **in_stack_00000060;
  int in_stack_000000a0;
  OSSL_LIB_CTX *in_stack_000000a8;
  char *in_stack_000000b0;
  char *in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff9c;
  char *in_stack_ffffffffffffffa0;
  undefined4 local_14;
  
  if ((in_RDI == (ASN1_VALUE **)0x0) || (in_RCX == (ASN1_ITEM *)0x0)) {
    ERR_new();
    ERR_set_debug(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff90);
    ERR_set_error(0xd,0xc0102,(char *)0x0);
    local_14 = 0;
  }
  else {
    local_14 = asn1_item_embed_d2i(in_stack_00000060,(uchar **)pval,(long)in,(ASN1_ITEM *)len,
                                   it._4_4_,(int)it,(char)libctx,(ASN1_TLC *)propq,in_stack_000000a0
                                   ,in_stack_000000a8,in_stack_000000b0);
    if (local_14 < 1) {
      ASN1_item_ex_free(in_RDI,in_RCX);
    }
  }
  return local_14;
}

Assistant:

static int asn1_item_ex_d2i_intern(ASN1_VALUE **pval, const unsigned char **in,
                                   long len, const ASN1_ITEM *it, int tag,
                                   int aclass, char opt, ASN1_TLC *ctx,
                                   OSSL_LIB_CTX *libctx, const char *propq)
{
    int rv;

    if (pval == NULL || it == NULL) {
        ERR_raise(ERR_LIB_ASN1, ERR_R_PASSED_NULL_PARAMETER);
        return 0;
    }
    rv = asn1_item_embed_d2i(pval, in, len, it, tag, aclass, opt, ctx, 0,
                             libctx, propq);
    if (rv <= 0)
        ASN1_item_ex_free(pval, it);
    return rv;
}